

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::HttpClientAdapter::DelayedEofInputStream::pumpTo
          (DelayedEofInputStream *this,AsyncOutputStream *output,uint64_t amount)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  Disposer *in_RCX;
  PromiseNode *extraout_RDX;
  Promise<unsigned_long> PVar2;
  Own<kj::_::PromiseNode> local_60;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_40;
  Own<kj::_::PromiseNode> local_30;
  
  (**(code **)(*output[2]._vptr_AsyncOutputStream + 0x18))(&local_60);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_60,
             _::
             TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:4257:17),_kj::_::PropagateException>
             ::anon_class_16_2_34952053_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0042bf98;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)output;
  this_00[1].dependency.disposer = in_RCX;
  intermediate.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)this_00;
  _::maybeChain<unsigned_long>(&local_40,(Promise<unsigned_long> *)&intermediate);
  pPVar1 = local_40.ptr;
  local_30.disposer = local_40.disposer;
  local_40.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_40);
  (this->super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)local_40.disposer;
  (this->inner).disposer = (Disposer *)pPVar1;
  local_30.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_30);
  Own<kj::_::PromiseNode>::dispose(&intermediate);
  Own<kj::_::PromiseNode>::dispose(&local_60);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<uint64_t> pumpTo(kj::AsyncOutputStream& output, uint64_t amount) override {
      return inner->pumpTo(output, amount)
          .then([this,amount](uint64_t actual) -> kj::Promise<uint64_t> {
        if (actual < amount) {
          // Must have reached EOF.
          KJ_IF_MAYBE(t, completionTask) {
            // Delay until completion.
            auto result = t->then([amount]() { return amount; });
            completionTask = nullptr;
            return result;
          } else {
            // Must have called tryRead() again after we already signaled EOF. Fine.
            return amount;
          }
        } else {
          return amount;
        }
      });
    }